

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_grzip.c
# Opt level: O2

int grzip_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int iVar2;
  ssize_t in_RAX;
  void *__s1;
  ssize_t avail;
  
  avail = in_RAX;
  __s1 = __archive_read_filter_ahead(filter,0xc,&avail);
  iVar1 = 0;
  if ((__s1 != (void *)0x0) && (avail != 0)) {
    iVar2 = bcmp(__s1,"GRZipII",0xc);
    iVar1 = 0x60;
    if (iVar2 != 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
grzip_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail;

	(void)self; /* UNUSED */

	p = __archive_read_filter_ahead(filter, sizeof(grzip_magic), &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, grzip_magic, sizeof(grzip_magic)))
		return (0);

	return (sizeof(grzip_magic) * 8);
}